

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

int isoent_gen_joliet_identifier(archive_write *a,isoent *isoent,idr *idr)

{
  void *pvVar1;
  isofile *piVar2;
  int iVar3;
  wchar_t wVar4;
  isoent *piVar5;
  char *pcVar6;
  size_t sVar7;
  int *piVar8;
  isoent *piVar9;
  int iVar10;
  int noff;
  char *pcVar11;
  uint uVar12;
  uchar *p;
  uint uVar13;
  isoent *piVar14;
  size_t __n;
  uint uVar15;
  archive_rb_tree_ops *in_stack_ffffffffffffff98;
  
  iVar10 = (isoent->children).cnt;
  iVar3 = 0;
  if (iVar10 != 0) {
    pvVar1 = a->format_data;
    uVar12 = 0x80;
    if ((*(uint *)((long)pvVar1 + 0x10370) & 0x60000) == 0x40000) {
      uVar12 = 0xce;
    }
    iVar3 = idr_start(a,idr,iVar10,6,2,0x292d00,in_stack_ffffffffffffff98);
    if (-1 < iVar3) {
      uVar15 = 1;
      piVar14 = isoent->parent;
      piVar9 = isoent;
      if (isoent->parent != isoent) {
        do {
          piVar5 = piVar14;
          uVar15 = uVar15 + piVar9->mb_len + 1;
          piVar14 = piVar5->parent;
          piVar9 = piVar5;
        } while (piVar5->parent != piVar5);
      }
      piVar14 = (isoent->children).first;
      if (piVar14 != (isoent *)0x0) {
        do {
          piVar2 = piVar14->file;
          __n = (piVar2->basename_utf16).length;
          if ((int)uVar12 < (int)__n) {
            __n = (ulong)uVar12;
          }
          pcVar6 = (char *)malloc(__n * 2 + 2);
          if (pcVar6 == (char *)0x0) {
            pcVar6 = "Can\'t allocate memory";
LAB_0022cbe6:
            archive_set_error(&a->archive,0xc,pcVar6);
            return -0x1e;
          }
          memcpy(pcVar6,(piVar2->basename_utf16).s,__n);
          pcVar11 = pcVar6 + __n;
          iVar10 = (int)pcVar11;
          (pcVar6 + __n)[0] = '\0';
          (pcVar6 + __n)[1] = '\0';
          piVar14->identifier = pcVar6;
          for (sVar7 = __n; sVar7 != 0; sVar7 = sVar7 - 2) {
            uVar13 = (uint)CONCAT11(*pcVar6,pcVar6[1]);
            if ((uVar13 < 0x20) ||
               ((uVar13 = uVar13 - 0x2a, uVar13 < 0x33 &&
                ((0x4000000230021U >> ((ulong)uVar13 & 0x3f) & 1) != 0)))) {
              pcVar6[0] = '\0';
              pcVar6[1] = '_';
            }
            else if ((*pcVar6 == '\0') && (pcVar6[1] == '.')) {
              pcVar11 = pcVar6;
            }
            iVar10 = (int)pcVar11;
            pcVar6 = pcVar6 + 2;
          }
          iVar10 = iVar10 - (int)piVar14->identifier;
          piVar14->ext_off = iVar10;
          uVar13 = (uint)__n;
          piVar14->ext_len = uVar13 - iVar10;
          piVar14->id_len = uVar13;
          if ((int)uVar12 < (int)(piVar14->file->basename_utf16).length) {
            wVar4 = archive_strncpy_l((archive_string *)((long)pvVar1 + 0x60),piVar14->identifier,
                                      __n,*(archive_string_conv **)((long)pvVar1 + 0x80));
            if ((wVar4 != L'\0') && (piVar8 = __errno_location(), *piVar8 == 0xc)) {
              pcVar6 = "No memory";
              goto LAB_0022cbe6;
            }
            iVar3 = *(int *)((long)pvVar1 + 0x68);
            piVar14->mb_len = iVar3;
            if (iVar3 == (int)(piVar14->file->basename).length) {
              iVar3 = 0;
            }
          }
          else {
            piVar14->mb_len = (int)(piVar14->file->basename).length;
            iVar3 = 0;
          }
          if (0xf0 < (int)(piVar14->mb_len + uVar15)) {
            pcVar6 = archive_entry_pathname(piVar14->file->entry);
            archive_set_error(&a->archive,-1,
                              "The regulation of Joliet extensions; A length of a full-pathname of `%s\' is longer than 240 bytes, (p=%d, b=%d)"
                              ,pcVar6,(ulong)uVar15,(ulong)(uint)piVar14->mb_len);
            return -0x1e;
          }
          if (uVar12 == uVar13) {
            noff = iVar10 + -6;
          }
          else if (uVar12 - 2 == uVar13) {
            noff = iVar10 + -4;
          }
          else {
            noff = iVar10 + -2;
            if (uVar12 - 4 != uVar13) {
              noff = iVar10;
            }
          }
          idr_register(idr,piVar14,iVar3,noff);
          piVar14 = piVar14->chnext;
        } while (piVar14 != (isoent *)0x0);
      }
      idr_resolve(idr,idr_set_num_beutf16);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int
isoent_gen_joliet_identifier(struct archive_write *a, struct isoent *isoent,
    struct idr *idr)
{
	struct iso9660 *iso9660;
	struct isoent *np;
	unsigned char *p;
	size_t l;
	int r;
	int ffmax, parent_len;
	static const struct archive_rb_tree_ops rb_ops = {
		isoent_cmp_node_joliet, isoent_cmp_key_joliet
	};

	if (isoent->children.cnt == 0)
		return (0);

	iso9660 = a->format_data;
	if (iso9660->opt.joliet == OPT_JOLIET_LONGNAME)
		ffmax = 206;
	else
		ffmax = 128;

	r = idr_start(a, idr, isoent->children.cnt, ffmax, 6, 2, &rb_ops);
	if (r < 0)
		return (r);

	parent_len = 1;
	for (np = isoent; np->parent != np; np = np->parent)
		parent_len += np->mb_len + 1;

	for (np = isoent->children.first; np != NULL; np = np->chnext) {
		unsigned char *dot;
		int ext_off, noff, weight;
		size_t lt;

		if ((int)(l = np->file->basename_utf16.length) > ffmax)
			l = ffmax;

		p = malloc((l+1)*2);
		if (p == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory");
			return (ARCHIVE_FATAL);
		}
		memcpy(p, np->file->basename_utf16.s, l);
		p[l] = 0;
		p[l+1] = 0;

		np->identifier = (char *)p;
		lt = l;
		dot = p + l;
		weight = 0;
		while (lt > 0) {
			if (!joliet_allowed_char(p[0], p[1]))
				archive_be16enc(p, 0x005F); /* '_' */
			else if (p[0] == 0 && p[1] == 0x2E) /* '.' */
				dot = p;
			p += 2;
			lt -= 2;
		}
		ext_off = (int)(dot - (unsigned char *)np->identifier);
		np->ext_off = ext_off;
		np->ext_len = (int)l - ext_off;
		np->id_len = (int)l;

		/*
		 * Get a length of MBS of a full-pathname.
		 */
		if ((int)np->file->basename_utf16.length > ffmax) {
			if (archive_strncpy_l(&iso9660->mbs,
			    (const char *)np->identifier, l,
				iso9660->sconv_from_utf16be) != 0 &&
			    errno == ENOMEM) {
				archive_set_error(&a->archive, errno,
				    "No memory");
				return (ARCHIVE_FATAL);
			}
			np->mb_len = (int)iso9660->mbs.length;
			if (np->mb_len != (int)np->file->basename.length)
				weight = np->mb_len;
		} else
			np->mb_len = (int)np->file->basename.length;

		/* If a length of full-pathname is longer than 240 bytes,
		 * it violates Joliet extensions regulation. */
		if (parent_len + np->mb_len > 240) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "The regulation of Joliet extensions;"
			    " A length of a full-pathname of `%s' is "
			    "longer than 240 bytes, (p=%d, b=%d)",
			    archive_entry_pathname(np->file->entry),
			    (int)parent_len, (int)np->mb_len);
			return (ARCHIVE_FATAL);
		}

		/* Make an offset of the number which is used to be set
		 * hexadecimal number to avoid duplicate identifier. */
		if ((int)l == ffmax)
			noff = ext_off - 6;
		else if ((int)l == ffmax-2)
			noff = ext_off - 4;
		else if ((int)l == ffmax-4)
			noff = ext_off - 2;
		else
			noff = ext_off;
		/* Register entry to the identifier resolver. */
		idr_register(idr, np, weight, noff);
	}

	/* Resolve duplicate identifier with Joliet Volume. */
	idr_resolve(idr, idr_set_num_beutf16);

	return (ARCHIVE_OK);
}